

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

void __thiscall stackjit::ClassMetadata::setParentClass(ClassMetadata *this,ClassType *parentClass)

{
  runtime_error *this_00;
  
  if (this->mParentClass == (ClassType *)0x0) {
    this->mParentClass = parentClass;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"The parent class has already been set.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ClassMetadata::setParentClass(const ClassType* parentClass) {
		if (mParentClass != nullptr) {
			throw std::runtime_error("The parent class has already been set.");
		}

		this->mParentClass = parentClass;
	}